

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-impl-test.cc
# Opt level: O0

void __thiscall FormatTest_StrError_Test::TestBody(FormatTest_StrError_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  char *pcVar4;
  AssertHelper *this_00;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  size_t message_size;
  AssertionResult gtest_ar_2;
  int result;
  int error_code;
  assertion_failure *e_1;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_1;
  assertion_failure *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  char buffer [256];
  char *message;
  AssertHelper *in_stack_fffffffffffffba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba8;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffffbb0;
  undefined1 in_stack_fffffffffffffbb7;
  char *in_stack_fffffffffffffbb8;
  int line;
  char *in_stack_fffffffffffffbc0;
  AssertionResult *this_02;
  undefined4 in_stack_fffffffffffffbc8;
  Type in_stack_fffffffffffffbcc;
  Type type;
  AssertionResult *in_stack_fffffffffffffbd0;
  AssertionResult *this_03;
  undefined7 in_stack_fffffffffffffc08;
  char *in_stack_fffffffffffffc10;
  undefined7 in_stack_fffffffffffffc18;
  undefined1 in_stack_fffffffffffffc1f;
  AssertHelper *in_stack_fffffffffffffc20;
  AssertHelper *this_04;
  undefined7 in_stack_fffffffffffffc50;
  uint *in_stack_fffffffffffffc58;
  char *in_stack_fffffffffffffc60;
  char *in_stack_fffffffffffffc68;
  AssertionResult local_2f8 [2];
  undefined4 local_2d4;
  AssertionResult local_2d0 [2];
  AssertionResult local_2b0 [2];
  undefined4 local_28c;
  AssertionResult local_288 [2];
  AssertHelper local_268 [4];
  AssertionResult local_248 [2];
  undefined4 local_224;
  AssertionResult local_220;
  size_t local_210;
  undefined4 local_1f4;
  AssertionResult local_1f0;
  int local_1e0;
  undefined4 local_1dc;
  byte local_1b2;
  allocator local_1b1;
  string local_1b0 [32];
  AssertionResult local_190 [3];
  int local_160;
  byte local_15a;
  allocator local_159;
  string local_158 [48];
  AssertionResult local_128;
  char local_118 [264];
  char *local_10;
  
  local_10 = (char *)0x0;
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,"invalid buffer",&local_159);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    local_15a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_10 = (char *)0x0;
      fmt::v5::anon_unknown_10::safe_strerror
                ((int)((ulong)in_stack_fffffffffffffbd0 >> 0x20),
                 (char **)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                 (size_t)in_stack_fffffffffffffbc0);
    }
    if ((local_15a & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffbd0,
                 (char (*) [131])CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      local_160 = 2;
    }
    else {
      local_160 = 0;
    }
    std::__cxx11::string::~string(local_158);
    if (local_160 != 0) goto LAB_00110dbd;
  }
  else {
LAB_00110dbd:
    testing::Message::Message((Message *)in_stack_fffffffffffffbd0);
    testing::AssertionResult::failure_message((AssertionResult *)0x110dd9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc,
               in_stack_fffffffffffffbc0,(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc20,
               (Message *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffba0);
    testing::Message::~Message((Message *)0x110e3c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x110e94);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_190);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b0,"invalid buffer",&local_1b1);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    local_1b2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_10 = local_118;
      fmt::v5::anon_unknown_10::safe_strerror
                ((int)((ulong)in_stack_fffffffffffffbd0 >> 0x20),
                 (char **)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                 (size_t)in_stack_fffffffffffffbc0);
    }
    if ((local_1b2 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffbd0,
                 (char (*) [130])CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      local_160 = 3;
    }
    else {
      local_160 = 0;
    }
    std::__cxx11::string::~string(local_1b0);
    if (local_160 == 0) goto LAB_001112f6;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffbd0);
  in_stack_fffffffffffffc58 =
       (uint *)testing::AssertionResult::failure_message((AssertionResult *)0x111248);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc,
             in_stack_fffffffffffffbc0,(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
             (char *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0));
  testing::internal::AssertHelper::operator=
            (in_stack_fffffffffffffc20,
             (Message *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
  testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffba0);
  testing::Message::~Message((Message *)0x1112ab);
LAB_001112f6:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x111303);
  local_118[0] = 'x';
  local_1dc = 0xffffffff;
  local_10 = local_118;
  local_1e0 = fmt::v5::anon_unknown_10::safe_strerror
                        ((int)((ulong)in_stack_fffffffffffffbd0 >> 0x20),
                         (char **)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                         (size_t)in_stack_fffffffffffffbc0);
  local_1f4 = 0;
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffffbb8,
             (char *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
             (int *)in_stack_fffffffffffffba8,(int *)in_stack_fffffffffffffba0);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1f0);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbd0);
    testing::AssertionResult::failure_message((AssertionResult *)0x1113f3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc,
               in_stack_fffffffffffffbc0,(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc20,
               (Message *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffba0);
    testing::Message::~Message((Message *)0x111456);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1114ae);
  local_210 = strlen(local_10);
  local_224 = 0xff;
  testing::internal::CmpHelperGE<unsigned_int,unsigned_long>
            (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
             (unsigned_long *)CONCAT17(uVar2,in_stack_fffffffffffffc50));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_220);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbd0);
    testing::AssertionResult::failure_message((AssertionResult *)0x111570);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc,
               in_stack_fffffffffffffbc0,(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc20,
               (Message *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffba0);
    testing::Message::~Message((Message *)0x1115d3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11162b);
  this_04 = local_268;
  get_system_error_abi_cxx11_(in_stack_fffffffffffffbcc);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char*>
            (in_stack_fffffffffffffbb8,
             (char *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
             in_stack_fffffffffffffba8,(char **)in_stack_fffffffffffffba0);
  std::__cxx11::string::~string((string *)local_268);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_248);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbd0);
    in_stack_fffffffffffffc10 =
         testing::AssertionResult::failure_message((AssertionResult *)0x111716);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc,
               in_stack_fffffffffffffbc0,(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0));
    testing::internal::AssertHelper::operator=
              (this_04,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffc18));
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffba0);
    testing::Message::~Message((Message *)0x111773);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1117cb);
  local_10 = local_118;
  local_1e0 = fmt::v5::anon_unknown_10::safe_strerror
                        ((int)((ulong)in_stack_fffffffffffffbd0 >> 0x20),
                         (char **)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                         (size_t)in_stack_fffffffffffffbc0);
  local_28c = 0x22;
  this_03 = local_288;
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffffbb8,
             (char *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
             (int *)in_stack_fffffffffffffba8,(int *)in_stack_fffffffffffffba0);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(this_03);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbd0);
    testing::AssertionResult::failure_message((AssertionResult *)0x11189f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc,
               in_stack_fffffffffffffbc0,(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0));
    testing::internal::AssertHelper::operator=
              (this_04,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffc18));
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffba0);
    testing::Message::~Message((Message *)0x1118fc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x111954);
  local_10 = local_118;
  local_1e0 = fmt::v5::anon_unknown_10::safe_strerror
                        ((int)((ulong)in_stack_fffffffffffffbd0 >> 0x20),
                         (char **)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                         (size_t)in_stack_fffffffffffffbc0);
  testing::internal::EqHelper<false>::Compare<char[256],char*>
            (in_stack_fffffffffffffbb8,
             (char *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
             (char (*) [256])in_stack_fffffffffffffba8,(char **)in_stack_fffffffffffffba0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbd0);
    in_stack_fffffffffffffbd0 =
         (AssertionResult *)testing::AssertionResult::failure_message((AssertionResult *)0x111a1e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc,
               in_stack_fffffffffffffbc0,(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0));
    testing::internal::AssertHelper::operator=
              (this_04,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffc18));
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffba0);
    testing::Message::~Message((Message *)0x111a7b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x111ad0);
  local_2d4 = 0x22;
  this_02 = local_2d0;
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffffbb8,
             (char *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
             (int *)in_stack_fffffffffffffba8,(int *)in_stack_fffffffffffffba0);
  line = (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffbcc);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbd0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x111b71);
    line = (int)((ulong)pcVar4 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbd0,type,&this_02->success_,line,
               (char *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0));
    testing::internal::AssertHelper::operator=
              (this_04,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffc18));
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffba0);
    testing::Message::~Message((Message *)0x111bce);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x111c23);
  this_01 = local_2f8;
  testing::internal::CmpHelperSTREQ
            ((char *)CONCAT17(uVar2,in_stack_fffffffffffffc18),in_stack_fffffffffffffc10,
             (char *)CONCAT17(uVar3,in_stack_fffffffffffffc08),&this_03->success_);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbd0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x111cb8)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbd0,type,&this_02->success_,line,
               (char *)CONCAT17(uVar3,in_stack_fffffffffffffbb0));
    testing::internal::AssertHelper::operator=
              (this_04,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffc18));
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x111d15);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x111d6a);
  return;
}

Assistant:

TEST(FormatTest, StrError) {
  char *message = FMT_NULL;
  char buffer[BUFFER_SIZE];
  EXPECT_ASSERT(fmt::safe_strerror(EDOM, message = FMT_NULL, 0),
                "invalid buffer");
  EXPECT_ASSERT(fmt::safe_strerror(EDOM, message = buffer, 0),
                "invalid buffer");
  buffer[0] = 'x';
#if defined(_GNU_SOURCE) && !defined(__COVERITY__)
  // Use invalid error code to make sure that safe_strerror returns an error
  // message in the buffer rather than a pointer to a static string.
  int error_code = -1;
#else
  int error_code = EDOM;
#endif

  int result = fmt::safe_strerror(error_code, message = buffer, BUFFER_SIZE);
  EXPECT_EQ(result, 0);
  std::size_t message_size = std::strlen(message);
  EXPECT_GE(BUFFER_SIZE - 1u, message_size);
  EXPECT_EQ(get_system_error(error_code), message);

  // safe_strerror never uses buffer on MinGW.
#ifndef __MINGW32__
  result = fmt::safe_strerror(error_code, message = buffer, message_size);
  EXPECT_EQ(ERANGE, result);
  result = fmt::safe_strerror(error_code, message = buffer, 1);
  EXPECT_EQ(buffer, message);  // Message should point to buffer.
  EXPECT_EQ(ERANGE, result);
  EXPECT_STREQ("", message);
#endif
}